

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
tinyusdz::Attribute::get_value<std::__cxx11::string>
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Attribute *this)

{
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  Attribute *local_18;
  Attribute *this_local;
  
  local_18 = this;
  this_local = (Attribute *)__return_storage_ptr__;
  primvar::PrimVar::get_value<std::__cxx11::string>(&local_40,&this->_var);
  nonstd::optional_lite::
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (__return_storage_ptr__,&local_40);
  nonstd::optional_lite::
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_40);
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    return _var.get_value<T>();
  }